

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::transform_if_to_case(Generator *top)

{
  undefined1 local_58 [8];
  TransformIfCase visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  TransformIfCase::TransformIfCase((TransformIfCase *)local_58);
  IRVisitor::visit_root_s
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  TransformIfCase::~TransformIfCase((TransformIfCase *)local_58);
  return;
}

Assistant:

void transform_if_to_case(Generator* top) {
    TransformIfCase visitor;
    visitor.visit_root_s(top);
}